

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O3

MPP_RET hal_h265e_vepu511_get_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  MppFrame frame;
  void *pvVar2;
  int *piVar3;
  long lVar4;
  MPP_RET MVar5;
  RK_S32 RVar6;
  int iVar7;
  MppMeta meta;
  int iVar8;
  uint slot_idx;
  
  pEVar1 = task->rc_task;
  frame = task->frame;
  iVar7 = *(int *)((long)hal + 0xb8);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0xa48);
  }
  pvVar2 = (task->syntax).data;
  *(void **)((long)hal + 0x3c0) = pvVar2;
  *(undefined8 *)((long)hal + 0x3c8) = *(undefined8 *)((long)pvVar2 + 0x128);
  *(uint *)((long)hal + 0x414) = (uint)(*(int *)(*(long *)((long)hal + 0x3b0) + 0x94) == 4);
  *(undefined4 *)((long)hal + 0x410) = *(undefined4 *)(*(long *)((long)hal + 0x3b0) + 0x1868);
  MVar5 = vepu511_h265_setup_hal_bufs((H265eV511HalContext *)hal);
  if (MVar5 == MPP_OK) {
    *(undefined4 *)((long)hal + 0x378) = *(undefined4 *)((long)hal + 0x374);
    piVar3 = *(int **)((long)hal + (long)iVar7 * 8 + 0x80);
    *(int **)((long)hal + 0x90) = piVar3;
    *(uint *)((long)hal + 0x374) = *(uint *)&pEVar1->frm >> 3 & 2;
    if (((pEVar1->frm).val & 0x400000000) == 0) {
      RVar6 = mpp_frame_has_meta(task->frame);
      if (RVar6 != 0) {
        meta = mpp_frame_get_meta(frame);
        mpp_meta_get_ptr(meta,KEY_ROI_DATA,(void **)((long)hal + 0x388));
        mpp_meta_get_ptr_d(meta,KEY_OSD_DATA3,(void **)((long)hal + 0x3a8),(void *)0x0);
      }
    }
    iVar7 = *(int *)((long)hal + 0xb8);
    (task->flags).reg_idx = iVar7;
    *(undefined8 *)((long)hal + 0x428) = *(undefined8 *)((long)hal + (long)iVar7 * 8 + 0x438);
    iVar8 = *(int *)((long)hal + 0xb0) + 1;
    *(int *)((long)hal + 0xb0) = iVar8;
    *piVar3 = iVar8;
    iVar7 = iVar7 + 1;
    MVar5 = MPP_OK;
    if (*(int *)((long)hal + 0xb4) <= iVar7) {
      iVar7 = 0;
    }
    *(int *)((long)hal + 0xb8) = iVar7;
    lVar4 = *(long *)((long)hal + 0x3c0);
    slot_idx = (uint)*(byte *)(lVar4 + 0xe8);
    piVar3[4] = slot_idx;
    piVar3[5] = (uint)*(byte *)(lVar4 + 0xe9);
    h265e_dpb_hal_start(*(H265eDpb **)((long)hal + 0x3c8),slot_idx);
    h265e_dpb_hal_start(*(H265eDpb **)((long)hal + 0x3c8),piVar3[5]);
    memset(piVar3 + 10,0,0x150);
    if (((byte)hal_h265e_debug & 4) != 0) {
      MVar5 = MPP_OK;
      _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0xa76);
    }
  }
  else {
    _mpp_log_l(2,"hal_h265e_v511","vepu541_h265_allocate_buffers failed, free buffers and return\n",
               "hal_h265e_vepu511_get_task");
    *(byte *)&(task->flags).err = (byte)(task->flags).err | 0x10;
    MVar5 = MPP_ERR_MALLOC;
  }
  return MVar5;
}

Assistant:

MPP_RET hal_h265e_vepu511_get_task(void *hal, HalEncTask *task)
{
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    Vepu511H265eFrmCfg *frm_cfg = NULL;
    MppFrame frame = task->frame;
    EncFrmStatus  *frm_status = &task->rc_task->frm;
    RK_S32 task_idx = ctx->task_idx;

    hal_h265e_enter();

    ctx->syn = (H265eSyntax_new *)task->syntax.data;
    ctx->dpb = (H265eDpb*)ctx->syn->dpb;
    ctx->smart_en = (ctx->cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC);
    ctx->qpmap_en = ctx->cfg->tune.deblur_en;

    if (vepu511_h265_setup_hal_bufs(ctx)) {
        hal_h265e_err("vepu541_h265_allocate_buffers failed, free buffers and return\n");
        task->flags.err |= HAL_ENC_TASK_ERR_ALLOC;
        return MPP_ERR_MALLOC;
    }

    ctx->last_frame_type = ctx->frame_type;
    frm_cfg = ctx->frms[task_idx];
    ctx->frm = frm_cfg;

    if (frm_status->is_intra) {
        ctx->frame_type = INTRA_FRAME;
    } else {
        ctx->frame_type = INTER_P_FRAME;
    }

    if (!frm_status->reencode && mpp_frame_has_meta(task->frame)) {
        MppMeta meta = mpp_frame_get_meta(frame);

        mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void **)&ctx->roi_data);
        mpp_meta_get_ptr_d(meta, KEY_OSD_DATA3, (void **)&ctx->osd_cfg.osd_data3, NULL);
    }

    task->flags.reg_idx = ctx->task_idx;
    ctx->ext_line_buf = ctx->ext_line_bufs[ctx->task_idx];
    frm_cfg->frame_count = ++ctx->frame_count;

    ctx->task_idx++;
    if (ctx->task_idx >= ctx->task_cnt)
        ctx->task_idx = 0;

    frm_cfg->hal_curr_idx = ctx->syn->sp.recon_pic.slot_idx;
    frm_cfg->hal_refr_idx = ctx->syn->sp.ref_pic.slot_idx;

    h265e_dpb_hal_start(ctx->dpb, frm_cfg->hal_curr_idx);
    h265e_dpb_hal_start(ctx->dpb, frm_cfg->hal_refr_idx);

    memset(&frm_cfg->feedback, 0, sizeof(Vepu511H265Fbk));

    hal_h265e_leave();
    return MPP_OK;
}